

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_sqlite.cpp
# Opt level: O3

sqlite3_value * duckdb::CastToSQLiteValue::Operation<double>(double input)

{
  sqlite3_value *sqlite_float;
  
  (sqlite_float->str)._M_dataplus._M_p = (pointer)&(sqlite_float->str).field_2;
  (sqlite_float->str)._M_string_length = 0;
  (sqlite_float->str).field_2._M_local_buf[0] = '\0';
  (sqlite_float->u).r = input;
  sqlite_float->type = FLOAT;
  return sqlite_float;
}

Assistant:

sqlite3_value CastToSQLiteValue::Operation(double input) {
	return OperationFloat<double>(input);
}